

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

void ma_linear_resampler_interpolate_frame_f32(ma_linear_resampler *pResampler,float *pFrameOut)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  float s;
  ma_uint32 channels;
  float a;
  ma_uint32 c;
  float *pFrameOut_local;
  ma_linear_resampler *pResampler_local;
  float r1;
  float r0;
  
  uVar1 = (pResampler->config).channels;
  if (pResampler == (ma_linear_resampler *)0x0) {
    __assert_fail("pResampler != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                  ,0x9738,
                  "void ma_linear_resampler_interpolate_frame_f32(ma_linear_resampler *, float *restrict)"
                 );
  }
  if (pFrameOut != (float *)0x0) {
    uVar2 = (pResampler->config).sampleRateOut;
    uVar3 = pResampler->inTimeFrac;
    for (channels = 0; channels < uVar1; channels = channels + 1) {
      pFrameOut[channels] =
           (pResampler->x0).f32[channels] +
           ((pResampler->x1).f32[channels] - (pResampler->x0).f32[channels]) *
           ((float)uVar3 / (float)uVar2);
    }
    return;
  }
  __assert_fail("pFrameOut != ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                ,0x9739,
                "void ma_linear_resampler_interpolate_frame_f32(ma_linear_resampler *, float *restrict)"
               );
}

Assistant:

static void ma_linear_resampler_interpolate_frame_f32(ma_linear_resampler* pResampler, float* MA_RESTRICT pFrameOut)
{
    ma_uint32 c;
    float a;
    const ma_uint32 channels = pResampler->config.channels;

    MA_ASSERT(pResampler != NULL);
    MA_ASSERT(pFrameOut  != NULL);

    a = (float)pResampler->inTimeFrac / pResampler->config.sampleRateOut;

    MA_ASSUME(channels > 0);
    for (c = 0; c < channels; c += 1) {
        float s = ma_mix_f32_fast(pResampler->x0.f32[c], pResampler->x1.f32[c], a);
        pFrameOut[c] = s;
    }
}